

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O2

void __thiscall CountOverJoin::run(CountOverJoin *this)

{
  unsigned_long uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint *__s;
  ostream *poVar5;
  ulong __n;
  unsigned_long __val;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  Launcher::getAggregateEngine((Launcher *)&bStack_88);
  std::dynamic_pointer_cast<FactorisedJoin,Engine>((shared_ptr<Engine> *)&local_68);
  std::__shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2> *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_88._M_string_length);
  lVar3 = std::chrono::_V2::system_clock::now();
  FactorisedJoin::run((this->_joinEngine).
                      super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->rootNode =
       ((this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       rootNode;
  lVar4 = std::chrono::_V2::system_clock::now();
  std::__cxx11::to_string(&local_48,lVar3 / -1000000 + lVar4 / 1000000);
  std::operator+(&bStack_88,"WORKER - join construction: ",&local_48);
  std::operator+(&local_68,&bStack_88,"ms.\n");
  std::operator<<((ostream *)&std::cout,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_48);
  lVar3 = std::chrono::_V2::system_clock::now();
  __n = (ulong)((((this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->numberOfCachedValues & 0xffff) << 2);
  __s = (uint *)operator_new__(__n);
  memset(__s,0,__n);
  this->cachedCounts = __s;
  uVar2 = count(this,this->rootNode,
                ((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
               );
  lVar4 = std::chrono::_V2::system_clock::now();
  std::__cxx11::to_string(&local_48,lVar3 / -1000000 + lVar4 / 1000000);
  std::operator+(&bStack_88,"WORKER - count calculation: ",&local_48);
  std::operator+(&local_68,&bStack_88,"ms.\n");
  std::operator<<((ostream *)&std::cout,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_48);
  this->numberOfValues = 0;
  memset(this->cachedCounts,0,__n);
  valueCount(this,this->rootNode,
             ((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root);
  std::__cxx11::to_string(&local_48,this->numberOfValues);
  std::operator+(&bStack_88,"DATA - Number of values in Factorised Representation: ",&local_48);
  std::operator+(&local_68,&bStack_88,".\n");
  std::operator<<((ostream *)&std::cout,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_48);
  __val = _NUM_OF_ATTRIBUTES * (ulong)uVar2;
  std::__cxx11::to_string(&local_48,__val);
  std::operator+(&bStack_88,"DATA - Number of values in Listing Representation: ",&local_48);
  std::operator+(&local_68,&bStack_88,".\n");
  std::operator<<((ostream *)&std::cout,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_48);
  auVar6._8_4_ = (int)(__val >> 0x20);
  auVar6._0_8_ = __val;
  auVar6._12_4_ = 0x45300000;
  uVar1 = this->numberOfValues;
  auVar7._8_4_ = (int)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._12_4_ = 0x45300000;
  std::__cxx11::to_string
            (&local_48,
             ((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)__val) - 4503599627370496.0)) /
             ((auVar7._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)));
  std::operator+(&bStack_88,"DATA - Compression Factor: ",&local_48);
  std::operator+(&local_68,&bStack_88,".\n");
  std::operator<<((ostream *)&std::cout,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_48);
  poVar5 = std::operator<<((ostream *)&std::cout,"DATA - Number of Tuples in join result: ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void CountOverJoin::run() 
{
    _joinEngine =
        std::dynamic_pointer_cast<FactorisedJoin>(_launcher->getAggregateEngine());

#ifdef BENCH
    int64_t startJoin = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch()).count();
#endif

    _joinEngine->run();

    rootNode = _joinEngine->getFactorisationRoot();

    BINFO(
        "WORKER - join construction: " + std::to_string(
            duration_cast<milliseconds>(
                system_clock::now().time_since_epoch()).count() - startJoin
            ) + "ms.\n"
        );

    DINFO("WORKER - join has been constructed. \n");

#ifdef BENCH
    int64_t startCount = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch()).count();
#endif

    unsigned short numberOfCachedValues = _joinEngine->getNumberOfCachedValues();

    cachedCounts = new unsigned int[numberOfCachedValues]();

    unsigned int tupleCount = count(rootNode, _dTree->_root); 

    BINFO(
        "WORKER - count calculation: " + std::to_string(
            duration_cast<milliseconds>(
                system_clock::now().time_since_epoch()).count() - startCount) +
        "ms.\n");


    numberOfValues = 0;
    memset(cachedCounts, 0, numberOfCachedValues * sizeof(unsigned int));
    valueCount(rootNode, _dTree->_root);

    // std::cout << "Number of cached values: "+std::to_string(numberOfCachedValues)+"\n";
    std::cout << "DATA - Number of values in Factorised Representation: "+ std::to_string(numberOfValues) +".\n";

    size_t flatValueCount = ((size_t)tupleCount) * dfdb::params::NUM_OF_ATTRIBUTES;
    std::cout << "DATA - Number of values in Listing Representation: "+std::to_string(flatValueCount)+".\n"; 

    std::cout << "DATA - Compression Factor: "+ std::to_string((double)flatValueCount / numberOfValues)+".\n";

    assert(tupleCount == rootNode -> count);

    std::cout << "DATA - Number of Tuples in join result: " <<
        (size_t) tupleCount << std::endl;
    // exit(0);
}